

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O1

vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::gather<glm::vec<4,unsigned_int,(glm::qualifier)0>>
          (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,polyscope *this,
          vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
          *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer pvVar5;
  long lVar6;
  allocator_type local_19;
  
  lVar6 = (long)(input->
                super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(input->
                super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0) {
    std::
    vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector(__return_storage_ptr__,
             (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
              *)this);
  }
  else {
    std::
    vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector(__return_storage_ptr__,lVar6 >> 2,&local_19);
    pvVar5 = (input->
             super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((input->
        super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        puVar1 = (undefined8 *)(*(long *)this + (ulong)(&pvVar5->field_0)[uVar4].x * 0x10);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&((__return_storage_ptr__->
                          super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar4 = uVar4 + 1;
        pvVar5 = (input->
                 super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
      } while (uVar4 < (ulong)((long)(input->
                                     super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 2
                              ));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}